

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

QPolygonF * __thiscall
QPainterPath::toFillPolygon(QPolygonF *__return_storage_ptr__,QPainterPath *this,QTransform *matrix)

{
  QPointF *pQVar1;
  bool bVar2;
  int i;
  undefined1 *puVar3;
  long lVar4;
  long in_FS_OFFSET;
  QPointF local_58;
  QArrayDataPointer<QPolygonF> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QPolygonF *)&DAT_aaaaaaaaaaaaaaaa;
  toSubpathPolygons((QList<QPolygonF> *)&local_48,this,matrix);
  (__return_storage_ptr__->super_QList<QPointF>).d.size = 0;
  (__return_storage_ptr__->super_QList<QPointF>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<QPointF>).d.ptr = (QPointF *)0x0;
  if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
    pQVar1 = ((local_48.ptr)->super_QList<QPointF>).d.ptr;
    local_58.xp = pQVar1->xp;
    local_58.yp = pQVar1->yp;
    lVar4 = 0;
    for (puVar3 = (undefined1 *)0x0; puVar3 < (ulong)local_48.size; puVar3 = puVar3 + 1) {
      QList<QPointF>::append
                (&__return_storage_ptr__->super_QList<QPointF>,
                 (QList<QPointF> *)((long)&((local_48.ptr)->super_QList<QPointF>).d.d + lVar4));
      bVar2 = QPolygonF::isClosed((QPolygonF *)
                                  ((long)&((local_48.ptr)->super_QList<QPointF>).d.d + lVar4));
      if (!bVar2) {
        QList<QPointF>::emplaceBack<QPointF_const&>
                  (&__return_storage_ptr__->super_QList<QPointF>,
                   *(QPointF **)((long)&((local_48.ptr)->super_QList<QPointF>).d.ptr + lVar4));
      }
      if (lVar4 != 0) {
        QList<QPointF>::emplaceBack<QPointF_const&>
                  (&__return_storage_ptr__->super_QList<QPointF>,&local_58);
      }
      lVar4 = lVar4 + 0x18;
    }
  }
  QArrayDataPointer<QPolygonF>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QPainterPath::toFillPolygon(const QTransform &matrix) const
{
    const QList<QPolygonF> flats = toSubpathPolygons(matrix);
    QPolygonF polygon;
    if (flats.isEmpty())
        return polygon;
    QPointF first = flats.first().first();
    for (int i=0; i<flats.size(); ++i) {
        polygon += flats.at(i);
        if (!flats.at(i).isClosed())
            polygon += flats.at(i).first();
        if (i > 0)
            polygon += first;
    }
    return polygon;
}